

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<SizeComputer,std::vector<CTxUndo,std::allocator<CTxUndo>>>
          (VectorFormatter<DefaultFormatter> *this,SizeComputer *s,
          vector<CTxUndo,_std::allocator<CTxUndo>_> *v)

{
  vector<Coin,_std::allocator<Coin>_> *pvVar1;
  ulong uVar2;
  long lVar3;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Coin,_std::allocator<Coin>_> *v_00;
  long in_FS_OFFSET;
  VectorFormatter<TxInUndoFormatter> local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  v_00 = &((v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
           super__Vector_impl_data._M_start)->vprevout;
  pvVar1 = &((v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
             super__Vector_impl_data._M_finish)->vprevout;
  uVar2 = ((long)pvVar1 - (long)v_00 >> 3) * -0x5555555555555555;
  lVar3 = 1;
  if ((0xfc < uVar2) && (lVar3 = 3, 0xffff < uVar2)) {
    lVar3 = (ulong)(uVar2 >> 0x20 != 0) * 4 + 5;
  }
  s->nSize = s->nSize + lVar3;
  if (v_00 != pvVar1) {
    do {
      VectorFormatter<TxInUndoFormatter>::Ser<SizeComputer,std::vector<Coin,std::allocator<Coin>>>
                (&local_29,s,v_00);
      v_00 = v_00 + 1;
    } while (v_00 != pvVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }